

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence_helpers.cpp
# Opt level: O0

SENode * __thiscall
spvtools::opt::LoopDependenceAnalysis::GetFirstTripInductionNode
          (LoopDependenceAnalysis *this,Loop *loop)

{
  bool bVar1;
  SENode *node;
  SENode *induction_init_SENode;
  int64_t induction_initial_value;
  Instruction *induction_instr;
  BasicBlock *condition_block;
  Loop *loop_local;
  LoopDependenceAnalysis *this_local;
  
  condition_block = (BasicBlock *)loop;
  loop_local = (Loop *)this;
  induction_instr = (Instruction *)Loop::FindConditionBlock(loop);
  if ((BasicBlock *)induction_instr == (BasicBlock *)0x0) {
    this_local = (LoopDependenceAnalysis *)0x0;
  }
  else {
    induction_initial_value =
         (int64_t)Loop::FindConditionVariable((Loop *)condition_block,(BasicBlock *)induction_instr)
    ;
    if ((Instruction *)induction_initial_value == (Instruction *)0x0) {
      this_local = (LoopDependenceAnalysis *)0x0;
    }
    else {
      induction_init_SENode = (SENode *)0x0;
      bVar1 = Loop::GetInductionInitValue
                        ((Loop *)condition_block,(Instruction *)induction_initial_value,
                         (int64_t *)&induction_init_SENode);
      if (bVar1) {
        node = ScalarEvolutionAnalysis::CreateConstant
                         (&this->scalar_evolution_,(int64_t)induction_init_SENode);
        this_local = (LoopDependenceAnalysis *)
                     ScalarEvolutionAnalysis::SimplifyExpression(&this->scalar_evolution_,node);
      }
      else {
        this_local = (LoopDependenceAnalysis *)0x0;
      }
    }
  }
  return (SENode *)this_local;
}

Assistant:

SENode* LoopDependenceAnalysis::GetFirstTripInductionNode(const Loop* loop) {
  BasicBlock* condition_block = loop->FindConditionBlock();
  if (!condition_block) {
    return nullptr;
  }
  Instruction* induction_instr = loop->FindConditionVariable(condition_block);
  if (!induction_instr) {
    return nullptr;
  }
  int64_t induction_initial_value = 0;
  if (!loop->GetInductionInitValue(induction_instr, &induction_initial_value)) {
    return nullptr;
  }

  SENode* induction_init_SENode = scalar_evolution_.SimplifyExpression(
      scalar_evolution_.CreateConstant(induction_initial_value));
  return induction_init_SENode;
}